

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeRhsOfIN(Parse *pParse,Expr *pExpr,int iTab)

{
  Vdbe *p_00;
  long lVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  KeyInfo *pKVar6;
  VdbeOp *pVVar7;
  CollSeq *pCVar8;
  int in_EDX;
  long in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  Expr *pE2;
  int r2;
  int r1;
  ExprList_item *pItem;
  ExprList *pList;
  int i_1;
  Expr *p;
  int regBloom;
  int addrBloom;
  int rc;
  int i;
  Select *pCopy;
  ExprList *pEList;
  Select *pSelect;
  SubrtnSig *pSig;
  Vdbe *v;
  int nVal;
  KeyInfo *pKeyInfo;
  Expr *pLeft;
  int addr;
  int addrOnce;
  char affinity;
  SelectDest dest;
  SelectDest *in_stack_000001a0;
  Select *in_stack_000001a8;
  Parse *in_stack_000001b0;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  Vdbe *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  Parse *in_stack_ffffffffffffff38;
  Expr *pExpr_00;
  char **ppcVar9;
  sqlite3 *in_stack_ffffffffffffff40;
  Parse *pParse_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Parse *in_stack_ffffffffffffff50;
  int local_a4;
  int local_9c;
  undefined4 *local_80;
  int local_50;
  undefined1 local_30 [8];
  int local_28;
  long lVar10;
  
  lVar10 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0;
  local_80 = (undefined4 *)0x0;
  p_00 = in_RDI->pVdbe;
  if (((*(uint *)(in_RSI + 4) & 0x40) == 0) && (in_RDI->iSelfTab == 0)) {
    if (((*(uint *)(in_RSI + 4) & 0x1000) != 0) &&
       (((*(uint *)(*(long *)(in_RSI + 0x20) + 4) & 2) == 0 &&
        (local_80 = (undefined4 *)
                    sqlite3DbMallocRawNN
                              ((sqlite3 *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
        local_80 != (undefined4 *)0x0)))) {
      *local_80 = *(undefined4 *)(*(long *)(in_RSI + 0x20) + 0x10);
      pcVar5 = exprINAffinity(in_stack_ffffffffffffff50,
                              (Expr *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
      ;
      *(char **)(local_80 + 2) = pcVar5;
    }
    if (((*(uint *)(in_RSI + 4) & 0x2000000) != 0) ||
       (iVar3 = findCompatibleInRhsSubrtn
                          (in_stack_ffffffffffffff38,
                           (Expr *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (SubrtnSig *)in_stack_ffffffffffffff28), iVar3 != 0)) {
      sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c);
      if ((*(uint *)(in_RSI + 4) & 0x1000) != 0) {
        sqlite3VdbeExplain(in_RDI,'\0',"REUSE LIST SUBQUERY %d",
                           (ulong)*(uint *)(*(long *)(in_RSI + 0x20) + 0x10));
      }
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,0);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,0);
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff0c);
      if (local_80 != (undefined4 *)0x0) {
        sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      goto LAB_001d393e;
    }
    *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x2000000;
    iVar3 = in_RDI->nMem + 1;
    in_RDI->nMem = iVar3;
    *(int *)(in_RSI + 0x44) = iVar3;
    iVar3 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,0);
    *(int *)(in_RSI + 0x40) = iVar3 + 1;
    if (local_80 != (undefined4 *)0x0) {
      *(undefined1 *)(local_80 + 1) = 0;
      local_80[5] = *(undefined4 *)(in_RSI + 0x40);
      local_80[6] = *(undefined4 *)(in_RSI + 0x44);
      local_80[4] = in_EDX;
      in_RDI->mSubrtnSig = (u8)(1 << ((byte)*local_80 & 7));
      sqlite3VdbeChangeP4((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                          (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff1c);
    }
    local_50 = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10),
                                 in_stack_ffffffffffffff0c);
  }
  iVar3 = sqlite3ExprVectorSize(*(Expr **)(in_RSI + 0x10));
  *(int *)(in_RSI + 0x2c) = in_EDX;
  sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,0);
  pKVar6 = sqlite3KeyInfoAlloc((sqlite3 *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                               in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  if ((*(uint *)(in_RSI + 4) & 0x1000) == 0) {
    if (*(long *)(in_RSI + 0x20) != 0) {
      pParse_00 = *(Parse **)(in_RSI + 0x20);
      pExpr_00 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
      sqlite3ExprAffinity((Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      if (pKVar6 != (KeyInfo *)0x0) {
        pCVar8 = sqlite3ExprCollSeq(pParse_00,pExpr_00);
        pKVar6->aColl[0] = pCVar8;
      }
      in_stack_ffffffffffffff34 = sqlite3GetTempReg(in_RDI);
      in_stack_ffffffffffffff30 = sqlite3GetTempReg(in_RDI);
      ppcVar9 = &pParse_00->zErrMsg;
      for (iVar3 = *(int *)&pParse_00->db; 0 < iVar3; iVar3 = iVar3 + -1) {
        in_stack_ffffffffffffff28 = (Vdbe *)*ppcVar9;
        if ((local_50 != 0) &&
           (iVar4 = sqlite3ExprIsConstant
                              ((Parse *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ),
                               (Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                              ), iVar4 == 0)) {
          sqlite3VdbeChangeToNoop
                    ((Vdbe *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff14);
          sqlite3VdbeChangeToNoop
                    ((Vdbe *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff14);
          *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) & 0xfdffffff;
          local_50 = 0;
        }
        sqlite3ExprCode((Parse *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (Expr *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        in_stack_ffffffffffffff14);
        in_stack_ffffffffffffff08 = 1;
        sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                          in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                          (char *)CONCAT44(in_stack_ffffffffffffff0c,1),in_stack_ffffffffffffff30);
        sqlite3VdbeAddOp4Int
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
        ppcVar9 = ppcVar9 + 3;
      }
      sqlite3ReleaseTempReg(in_RDI,in_stack_ffffffffffffff34);
      sqlite3ReleaseTempReg(in_RDI,in_stack_ffffffffffffff30);
    }
  }
  else {
    lVar1 = *(long *)(in_RSI + 0x20);
    piVar2 = *(int **)(lVar1 + 0x20);
    pcVar5 = "CORRELATED ";
    if (local_50 != 0) {
      pcVar5 = "";
    }
    sqlite3VdbeExplain(in_RDI,'\x01',"%sLIST SUBQUERY %d",pcVar5,(ulong)*(uint *)(lVar1 + 0x10));
    if (*piVar2 == iVar3) {
      memset(local_30,0xaa,0x28);
      local_a4 = 0;
      sqlite3SelectDestInit((SelectDest *)local_30,0xb,in_EDX);
      exprINAffinity(in_stack_ffffffffffffff50,
                     (Expr *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      *(undefined4 *)(lVar1 + 8) = 0;
      if ((local_50 != 0) && ((in_RDI->db->dbOptFlags & 0x80000) == 0)) {
        iVar4 = in_RDI->nMem + 1;
        in_RDI->nMem = iVar4;
        local_a4 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,
                                                      in_stack_ffffffffffffff10),
                                     in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,0);
        local_28 = iVar4;
      }
      sqlite3SelectDup(in_stack_ffffffffffffff40,(Select *)in_stack_ffffffffffffff38,
                       in_stack_ffffffffffffff34);
      if (in_RDI->db->mallocFailed == '\0') {
        iVar4 = sqlite3Select(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
      }
      else {
        iVar4 = 1;
      }
      in_stack_ffffffffffffff24 = iVar4;
      sqlite3SelectDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (Select *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      if (local_a4 != 0) {
        in_stack_ffffffffffffff20 = local_28;
        pVVar7 = sqlite3VdbeGetOp(p_00,local_50);
        pVVar7->p3 = in_stack_ffffffffffffff20;
        if (local_28 == 0) {
          sqlite3VdbeChangeToNoop
                    ((Vdbe *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff14);
        }
        else {
          in_stack_ffffffffffffff1c = local_28;
          pVVar7 = sqlite3VdbeGetOp(p_00,local_50);
          pVVar7->p3 = in_stack_ffffffffffffff1c;
        }
      }
      if (iVar4 != 0) {
        sqlite3KeyInfoUnref((KeyInfo *)0x1d35d7);
        goto LAB_001d393e;
      }
      for (local_9c = 0; local_9c < iVar3; local_9c = local_9c + 1) {
        sqlite3VectorFieldSubexpr
                  ((Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
        pCVar8 = sqlite3BinaryCompareCollSeq
                           ((Parse *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            (Expr *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (Expr *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        pKVar6->aColl[local_9c] = pCVar8;
      }
    }
  }
  if (local_80 != (undefined4 *)0x0) {
    *(undefined1 *)(local_80 + 1) = 1;
  }
  if (pKVar6 != (KeyInfo *)0x0) {
    sqlite3VdbeChangeP4((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                        (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c);
  }
  if (local_50 != 0) {
    sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c);
    sqlite3VdbeAddOp3(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                      in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    sqlite3ClearTempRegCache(in_RDI);
  }
LAB_001d393e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRhsOfIN(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN operator */
  int iTab                /* Use this cursor number */
){
  int addrOnce = 0;           /* Address of the OP_Once instruction at top */
  int addr;                   /* Address of OP_OpenEphemeral instruction */
  Expr *pLeft;                /* the LHS of the IN operator */
  KeyInfo *pKeyInfo = 0;      /* Key information */
  int nVal;                   /* Size of vector pLeft */
  Vdbe *v;                    /* The prepared statement under construction */
  SubrtnSig *pSig = 0;        /* Signature for this subroutine */

  v = pParse->pVdbe;
  assert( v!=0 );

  /* The evaluation of the IN must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can compute the RHS just once
  ** and reuse it many names.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) && pParse->iSelfTab==0 ){
    /* Reuse of the RHS is allowed
    **
    ** Compute a signature for the RHS of the IN operator to facility
    ** finding and reusing prior instances of the same IN operator.
    */
    assert( !ExprUseXSelect(pExpr) || pExpr->x.pSelect!=0 );
    if( ExprUseXSelect(pExpr) && (pExpr->x.pSelect->selFlags & SF_All)==0 ){
      pSig = sqlite3DbMallocRawNN(pParse->db, sizeof(pSig[0]));
      if( pSig ){
        pSig->selId = pExpr->x.pSelect->selId;
        pSig->zAff = exprINAffinity(pParse, pExpr);
      }
    }

    /* Check to see if there is a prior materialization of the RHS of
    ** this IN operator.  If there is, then make use of that prior
    ** materialization rather than recomputing it.
    */
    if( ExprHasProperty(pExpr, EP_Subrtn)
     || findCompatibleInRhsSubrtn(pParse, pExpr, pSig)
    ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      if( ExprUseXSelect(pExpr) ){
        ExplainQueryPlan((pParse, 0, "REUSE LIST SUBQUERY %d",
              pExpr->x.pSelect->selId));
      }
      assert( ExprUseYSub(pExpr) );
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      assert( iTab!=pExpr->iTable );
      sqlite3VdbeAddOp2(v, OP_OpenDup, iTab, pExpr->iTable);
      sqlite3VdbeJumpHere(v, addrOnce);
      if( pSig ){
        sqlite3DbFree(pParse->db, pSig->zAff);
        sqlite3DbFree(pParse->db, pSig);
      }
      return;
    }

    /* Begin coding the subroutine */
    assert( !ExprUseYWin(pExpr) );
    ExprSetProperty(pExpr, EP_Subrtn);
    assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;
    if( pSig ){
      pSig->bComplete = 0;
      pSig->iAddr = pExpr->y.sub.iAddr;
      pSig->regReturn = pExpr->y.sub.regReturn;
      pSig->iTable = iTab;
      pParse->mSubrtnSig = 1 << (pSig->selId&7);
      sqlite3VdbeChangeP4(v, -1, (const char*)pSig, P4_SUBRTNSIG);
    }
    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* Check to see if this is a vector IN operator */
  pLeft = pExpr->pLeft;
  nVal = sqlite3ExprVectorSize(pLeft);

  /* Construct the ephemeral table that will contain the content of
  ** RHS of the IN operator.
  */
  pExpr->iTable = iTab;
  addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, nVal);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  if( ExprUseXSelect(pExpr) ){
    VdbeComment((v, "Result of SELECT %u", pExpr->x.pSelect->selId));
  }else{
    VdbeComment((v, "RHS of IN operator"));
  }
#endif
  pKeyInfo = sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

  if( ExprUseXSelect(pExpr) ){
    /* Case 1:     expr IN (SELECT ...)
    **
    ** Generate code to write the results of the select into the temporary
    ** table allocated and opened above.
    */
    Select *pSelect = pExpr->x.pSelect;
    ExprList *pEList = pSelect->pEList;

    ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSelect->selId
    ));
    /* If the LHS and RHS of the IN operator do not match, that
    ** error will have been caught long before we reach this point. */
    if( ALWAYS(pEList->nExpr==nVal) ){
      Select *pCopy;
      SelectDest dest;
      int i;
      int rc;
      int addrBloom = 0;
      sqlite3SelectDestInit(&dest, SRT_Set, iTab);
      dest.zAffSdst = exprINAffinity(pParse, pExpr);
      pSelect->iLimit = 0;
      if( addrOnce && OptimizationEnabled(pParse->db, SQLITE_BloomFilter) ){
        int regBloom = ++pParse->nMem;
        addrBloom = sqlite3VdbeAddOp2(v, OP_Blob, 10000, regBloom);
        VdbeComment((v, "Bloom filter"));
        dest.iSDParm2 = regBloom;
      }
      testcase( pSelect->selFlags & SF_Distinct );
      testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
      pCopy = sqlite3SelectDup(pParse->db, pSelect, 0);
      rc = pParse->db->mallocFailed ? 1 :sqlite3Select(pParse, pCopy, &dest);
      sqlite3SelectDelete(pParse->db, pCopy);
      sqlite3DbFree(pParse->db, dest.zAffSdst);
      if( addrBloom ){
        sqlite3VdbeGetOp(v, addrOnce)->p3 = dest.iSDParm2;
        if( dest.iSDParm2==0 ){
          sqlite3VdbeChangeToNoop(v, addrBloom);
        }else{
          sqlite3VdbeGetOp(v, addrOnce)->p3 = dest.iSDParm2;
        }
      }
      if( rc ){
        sqlite3KeyInfoUnref(pKeyInfo);
        return;
      }
      assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
      assert( pEList!=0 );
      assert( pEList->nExpr>0 );
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      for(i=0; i<nVal; i++){
        Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
        pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
            pParse, p, pEList->a[i].pExpr
        );
      }
    }
  }else if( ALWAYS(pExpr->x.pList!=0) ){
    /* Case 2:     expr IN (exprlist)
    **
    ** For each expression, build an index key from the evaluation and
    ** store it in the temporary table. If <expr> is a column, then use
    ** that columns affinity when building index keys. If <expr> is not
    ** a column, use numeric affinity.
    */
    char affinity;            /* Affinity of the LHS of the IN */
    int i;
    ExprList *pList = pExpr->x.pList;
    struct ExprList_item *pItem;
    int r1, r2;
    affinity = sqlite3ExprAffinity(pLeft);
    if( affinity<=SQLITE_AFF_NONE ){
      affinity = SQLITE_AFF_BLOB;
    }else if( affinity==SQLITE_AFF_REAL ){
      affinity = SQLITE_AFF_NUMERIC;
    }
    if( pKeyInfo ){
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    }

    /* Loop through each expression in <exprlist>. */
    r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3GetTempReg(pParse);
    for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
      Expr *pE2 = pItem->pExpr;

      /* If the expression is not constant then we will need to
      ** disable the test that was generated above that makes sure
      ** this code only executes once.  Because for a non-constant
      ** expression we need to rerun this code each time.
      */
      if( addrOnce && !sqlite3ExprIsConstant(pParse, pE2) ){
        sqlite3VdbeChangeToNoop(v, addrOnce-1);
        sqlite3VdbeChangeToNoop(v, addrOnce);
        ExprClearProperty(pExpr, EP_Subrtn);
        addrOnce = 0;
      }

      /* Evaluate the expression and insert it into the temp table */
      sqlite3ExprCode(pParse, pE2, r1);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, r1, 1, r2, &affinity, 1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r2, r1, 1);
    }
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
  if( pSig ) pSig->bComplete = 1;
  if( pKeyInfo ){
    sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
  }
  if( addrOnce ){
    sqlite3VdbeAddOp1(v, OP_NullRow, iTab);
    sqlite3VdbeJumpHere(v, addrOnce);
    /* Subroutine return */
    assert( ExprUseYSub(pExpr) );
    assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
            || pParse->nErr );
    sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr, 1);
    VdbeCoverage(v);
    sqlite3ClearTempRegCache(pParse);
  }
}